

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O2

void __thiscall duckdb::CSVSniffer::DetectDialect(CSVSniffer *this)

{
  CSVReaderOptions *options;
  pointer puVar1;
  CSVErrorHandler *this_00;
  pointer puVar2;
  _Head_base<0UL,_duckdb::ColumnCountScanner_*,_false> local_270;
  idx_t best_ignored_rows;
  idx_t prev_padding_count;
  idx_t best_consistent_rows;
  idx_t rows_read;
  vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
  csv_state_machines;
  string local_228;
  CSVError error;
  DialectCandidates dialect_candidates;
  CSVError local_c0;
  
  DialectCandidates::DialectCandidates(&dialect_candidates,(CSVStateMachineOptions *)this->options);
  rows_read = 0;
  best_consistent_rows = 0;
  prev_padding_count = 0;
  best_ignored_rows = 0;
  csv_state_machines.
  super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  csv_state_machines.
  super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  csv_state_machines.
  super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GenerateStateMachineSearchSpace(this,&csv_state_machines,&dialect_candidates);
  puVar1 = csv_state_machines.
           super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = csv_state_machines.
                super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_270._M_head_impl =
         (puVar2->
         super_unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnCountScanner_*,_std::default_delete<duckdb::ColumnCountScanner>_>
         .super__Head_base<0UL,_duckdb::ColumnCountScanner_*,_false>._M_head_impl;
    (puVar2->
    super_unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>_>).
    _M_t.
    super___uniq_ptr_impl<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnCountScanner_*,_std::default_delete<duckdb::ColumnCountScanner>_>
    .super__Head_base<0UL,_duckdb::ColumnCountScanner_*,_false>._M_head_impl =
         (ColumnCountScanner *)0x0;
    AnalyzeDialectCandidate
              (this,(unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                     *)&local_270,&rows_read,&best_consistent_rows,&prev_padding_count,
               &best_ignored_rows);
    if (local_270._M_head_impl != (ColumnCountScanner *)0x0) {
      (*((local_270._M_head_impl)->super_BaseScanner)._vptr_BaseScanner[1])();
    }
    local_270._M_head_impl = (ColumnCountScanner *)0x0;
  }
  RefineCandidates(this);
  if ((this->candidates).
      super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->candidates).
      super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    CSVError::CSVError(&error);
    if (this->all_fail_max_line_size == true) {
      CSVError::operator=(&error,&this->line_error);
    }
    else {
      options = this->options;
      DialectCandidates::Print_abi_cxx11_(&local_228,&dialect_candidates);
      CSVError::SniffingError
                (&local_c0,options,&local_228,this->max_columns_found_error,&this->set_columns);
      CSVError::operator=(&error,&local_c0);
      CSVError::~CSVError(&local_c0);
      ::std::__cxx11::string::~string((string *)&local_228);
    }
    this_00 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(&this->error_handler);
    CSVErrorHandler::Error(this_00,&error,true);
    CSVError::~CSVError(&error);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ::~vector(&csv_state_machines.
             super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
           );
  DialectCandidates::~DialectCandidates(&dialect_candidates);
  return;
}

Assistant:

void CSVSniffer::DetectDialect() {
	// Variables for Dialect Detection
	DialectCandidates dialect_candidates(options.dialect_options.state_machine_options);
	// Number of rows read
	idx_t rows_read = 0;
	// Best Number of consistent rows (i.e., presenting all columns)
	idx_t best_consistent_rows = 0;
	// If padding was necessary (i.e., rows are missing some columns, how many)
	idx_t prev_padding_count = 0;
	// Min number of ignores rows
	idx_t best_ignored_rows = 0;
	// Vector of CSV State Machines
	vector<unique_ptr<ColumnCountScanner>> csv_state_machines;
	// Step 1: Generate state machines
	GenerateStateMachineSearchSpace(csv_state_machines, dialect_candidates);
	// Step 2: Analyze all candidates on the first chunk
	for (auto &state_machine : csv_state_machines) {
		AnalyzeDialectCandidate(std::move(state_machine), rows_read, best_consistent_rows, prev_padding_count,
		                        best_ignored_rows);
	}
	// Step 3: Loop over candidates and find if they can still produce good results for the remaining chunks
	RefineCandidates();

	// if no dialect candidate was found, we throw an exception
	if (candidates.empty()) {
		CSVError error;
		if (all_fail_max_line_size) {
			error = line_error;
		} else {
			error = CSVError::SniffingError(options, dialect_candidates.Print(), max_columns_found_error, set_columns);
		}
		error_handler->Error(error, true);
	}
}